

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaderprogram.cpp
# Opt level: O0

int __thiscall graphics101::ShaderProgram::link(ShaderProgram *this,char *__from,char *__to)

{
  uint uVar1;
  undefined8 uVar2;
  bool bVar3;
  ostream *poVar4;
  size_type sVar5;
  uint *puVar6;
  reference puVar7;
  undefined8 extraout_RAX;
  uint *shader;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  undefined1 local_60 [4];
  GLint num_attached_shaders;
  vector<unsigned_int,_std::allocator<unsigned_int>_> attached_shaders;
  _anonymous_namespace_ local_38 [36];
  int local_14;
  ShaderProgram *pSStack_10;
  GLint status;
  ShaderProgram *this_local;
  
  pSStack_10 = this;
  (*gl3wProcs.ptr[0x14e])((ulong)this->m_program);
  local_14 = 0;
  (*gl3wProcs.ptr[0xf2])((ulong)this->m_program,0x8b82,&local_14);
  if (local_14 != 1) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Shader linker error: ");
    poVar4 = std::operator<<(poVar4,'\n');
    (anonymous_namespace)::getProgramInfoLog_abi_cxx11_(local_38,this->m_program);
    poVar4 = std::operator<<(poVar4,(string *)local_38);
    std::operator<<(poVar4,'\n');
    std::__cxx11::string::~string((string *)local_38);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
  __range1._4_4_ = 0;
  (*gl3wProcs.ptr[0xf2])((ulong)this->m_program,0x8b85,(long)&__range1 + 4);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60,(long)__range1._4_4_);
  uVar2 = gl3wProcs.ptr[0xc0];
  uVar1 = this->m_program;
  sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
  puVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
  (*(code *)uVar2)((ulong)uVar1,sVar5 & 0xffffffff,0,puVar6);
  __end1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
  shader = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                *)&shader);
    if (!bVar3) break;
    puVar7 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end1);
    (*gl3wProcs.ptr[0x7c])((ulong)this->m_program,(ulong)*puVar7);
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&__end1);
  }
  bVar3 = local_14 != 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
  return (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),bVar3);
}

Assistant:

bool ShaderProgram::link() {
    glLinkProgram( m_program );
    
    GLint status = 0;
    glGetProgramiv( m_program, GL_LINK_STATUS, &status );
    
    if( status != GL_TRUE ) {
        cerr << "Shader linker error: " << '\n' << getProgramInfoLog(m_program) << '\n';
    }
    
    // Now that we have linked, detach all shaders.
    std::vector< GLuint > attached_shaders;
    {
        GLint num_attached_shaders = 0;
        glGetProgramiv( m_program, GL_ATTACHED_SHADERS, &num_attached_shaders );
        attached_shaders.resize( num_attached_shaders );
    }
    glGetAttachedShaders( m_program, attached_shaders.size(), nullptr, attached_shaders.data() );
    
	// Free the shaders by detaching them. (They have already been marked for deletion.)
	for( const auto& shader : attached_shaders ) {
	    glDetachShader( m_program, shader );
	}

    return status;
}